

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O3

Aig_Obj_t * Csw_ObjTwoVarCut(Csw_Man_t *p,Csw_Cut_t *pCut)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  Aig_Obj_t *p1;
  ulong uVar6;
  Aig_Obj_t *p0;
  
  if (pCut->nFanins < '\x03') {
    __assert_fail("pCut->nFanins > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x19d,"Aig_Obj_t *Csw_ObjTwoVarCut(Csw_Man_t *, Csw_Cut_t *)");
  }
  iVar3 = Csw_CutSupportMinimize(p,pCut);
  if (iVar3 != 2) {
    __assert_fail("nVars == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x1a0,"Aig_Obj_t *Csw_ObjTwoVarCut(Csw_Man_t *, Csw_Cut_t *)");
  }
  pVVar2 = p->pManRes->vObjs;
  if (pVVar2 == (Vec_Ptr_t *)0x0) {
    p0 = (Aig_Obj_t *)0x0;
    p1 = (Aig_Obj_t *)0x0;
  }
  else {
    uVar1 = *(uint *)&pCut[1].pNext;
    if (((int)uVar1 < 0) || (pVVar2->nSize <= (int)uVar1)) {
LAB_004f035d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    uVar5 = *(uint *)((long)&pCut[1].pNext + 4);
    if (((long)(int)uVar5 < 0) || ((uint)pVVar2->nSize <= uVar5)) goto LAB_004f035d;
    p0 = (Aig_Obj_t *)pVVar2->pArray[uVar1];
    p1 = (Aig_Obj_t *)pVVar2->pArray[(int)uVar5];
  }
  uVar5 = *(uint *)((long)&pCut[1].pNext + (long)pCut->nLeafMax * 4) & 0xf;
  uVar1 = uVar5 - 7;
  if ((uVar1 < 8) && ((0xd1U >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar5 = *(uint *)(&DAT_009e18d0 + (ulong)uVar1 * 4);
    uVar6 = 1;
  }
  else {
    uVar6 = 0;
  }
  pAVar4 = (Aig_Obj_t *)0x0;
  switch(uVar5) {
  case 1:
    p0 = (Aig_Obj_t *)((ulong)p0 ^ 1);
  case 2:
    p1 = (Aig_Obj_t *)((ulong)p1 ^ 1);
    break;
  default:
    goto switchD_004f0331_caseD_3;
  case 4:
    p0 = (Aig_Obj_t *)((ulong)p0 ^ 1);
    break;
  case 8:
    break;
  }
  pAVar4 = Aig_And(p->pManRes,p0,p1);
  if (pAVar4 == (Aig_Obj_t *)0x0) {
    pAVar4 = (Aig_Obj_t *)0x0;
  }
  else {
    pAVar4 = (Aig_Obj_t *)(uVar6 ^ (ulong)pAVar4);
  }
switchD_004f0331_caseD_3:
  return pAVar4;
}

Assistant:

Aig_Obj_t * Csw_ObjTwoVarCut( Csw_Man_t * p, Csw_Cut_t * pCut )
{
    Aig_Obj_t * pRes, * pIn0, * pIn1;
    int nVars, uTruth, fCompl = 0;
    assert( pCut->nFanins > 2 );
    // minimize support of this cut
    nVars = Csw_CutSupportMinimize( p, pCut );
    assert( nVars == 2 );
    // get the fanins
    pIn0 = Aig_ManObj( p->pManRes, pCut->pFanins[0] );
    pIn1 = Aig_ManObj( p->pManRes, pCut->pFanins[1] );
    // derive the truth table
    uTruth = 0xF & *Csw_CutTruth(pCut);
    if ( uTruth == 14 || uTruth == 13 || uTruth == 11 || uTruth == 7 )
    {
        uTruth = 0xF & ~uTruth;
        fCompl = 1;
    }
    // compute the result
    pRes = NULL;
    if ( uTruth == 1  )  // 0001  // 1110  14
        pRes = Aig_And( p->pManRes, Aig_Not(pIn0), Aig_Not(pIn1) );
    if ( uTruth == 2  )  // 0010  // 1101  13 
        pRes = Aig_And( p->pManRes,         pIn0 , Aig_Not(pIn1) );
    if ( uTruth == 4  )  // 0100  // 1011  11
        pRes = Aig_And( p->pManRes, Aig_Not(pIn0),         pIn1  );
    if ( uTruth == 8  )  // 1000  // 0111   7
        pRes = Aig_And( p->pManRes,         pIn0 ,         pIn1  );
    if ( pRes )
        pRes = Aig_NotCond( pRes, fCompl );
    return pRes;
}